

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O1

void __thiscall tchecker::clockbounds::local_m_map_t::clear(local_m_map_t *this)

{
  make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_> *pmVar1;
  pointer ppmVar2;
  ulong uVar3;
  
  if (this->_loc_nb != 0) {
    uVar3 = 0;
    do {
      pmVar1 = (this->_M).
               super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3];
      if (pmVar1 != (make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_> *)0x0) {
        operator_delete__(pmVar1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->_loc_nb);
  }
  ppmVar2 = (this->_M).
            super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_M).
      super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppmVar2) {
    (this->_M).
    super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppmVar2;
  }
  this->_loc_nb = 0;
  this->_clock_nb = 0;
  return;
}

Assistant:

void local_m_map_t::clear()
{
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id)
    tchecker::clockbounds::deallocate_map(_M[id]);
  _M.clear();
  _loc_nb = 0;
  _clock_nb = 0;
}